

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TexImageCubeArrayBufferCase::createTexture
          (TexImageCubeArrayBufferCase *this)

{
  int iVar1;
  int depth;
  deUint32 slicePitch_00;
  int rowPitch_00;
  reference pvVar2;
  size_type sVar3;
  deUint32 local_128;
  int local_124;
  PixelBufferAccess local_118;
  Vector<float,_4> local_ec;
  Vector<float,_4> local_dc;
  undefined1 local_cc [8];
  Vec4 colorB;
  Vector<float,_4> local_ac;
  undefined1 local_9c [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 local_40;
  deUint32 buf;
  deUint32 tex;
  int slicePitch;
  int imageHeight;
  int rowPitch;
  int rowLength;
  int pixelSize;
  TransferFormat local_20;
  TransferFormat transferFmt;
  TexImageCubeArrayBufferCase *this_local;
  
  _rowLength = (this->super_TextureCubeArraySpecCase).m_texFormat;
  transferFmt = (TransferFormat)this;
  local_20 = glu::getTransferFormat(_rowLength);
  rowPitch = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeArraySpecCase).m_texFormat);
  if (this->m_rowLength < 1) {
    local_124 = (this->super_TextureCubeArraySpecCase).m_size;
  }
  else {
    local_124 = this->m_rowLength;
  }
  imageHeight = local_124;
  slicePitch = deAlign32(local_124 * rowPitch,this->m_alignment);
  if (this->m_imageHeight < 1) {
    local_128 = (this->super_TextureCubeArraySpecCase).m_size;
  }
  else {
    local_128 = this->m_imageHeight;
  }
  tex = local_128;
  buf = local_128 * slicePitch;
  local_40 = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,
             (long)(int)(buf * ((this->super_TextureCubeArraySpecCase).m_depth + this->m_skipImages)
                        + this->m_offset));
  tcu::operator-((tcu *)(cBias.m_data + 2),
                 &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMax,
                 &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_TextureCubeArraySpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_ac,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_9c,&local_ac,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_ec,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_dc,&local_ec,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_cc,&local_dc,(Vector<float,_4> *)(colorA.m_data + 2));
  rowPitch_00 = slicePitch;
  slicePitch_00 = buf;
  iVar1 = (this->super_TextureCubeArraySpecCase).m_size;
  depth = (this->super_TextureCubeArraySpecCase).m_depth;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_118,&(this->super_TextureCubeArraySpecCase).m_texFormat,iVar1,iVar1,depth,
             rowPitch_00,slicePitch_00,
             pvVar2 + (long)this->m_offset +
                      (long)(this->m_skipPixels * rowPitch) +
                      (long)(this->m_skipRows * slicePitch) + (long)(int)(this->m_skipImages * buf))
  ;
  tcu::fillWithGrid(&local_118,4,(Vec4 *)local_9c,(Vec4 *)local_cc);
  sglr::ContextWrapper::glGenBuffers
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindBuffer
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x88ec,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,0);
  sglr::ContextWrapper::glBufferData
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x88ec,(long)(int)sVar3,pvVar2,0x88e4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x806e,this->m_imageHeight);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x806d,this->m_skipImages);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0xcf5,this->m_alignment);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             &local_40);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,local_40);
  iVar1 = (this->super_TextureCubeArraySpecCase).m_size;
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
             0x9009,0,*(int *)&(this->super_TextureCubeArraySpecCase).field_0xd4,iVar1,iVar1,
             (this->super_TextureCubeArraySpecCase).m_depth,0,local_20.format,local_20.dataType,
             (void *)(long)this->m_offset);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_size;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						imageHeight		= m_imageHeight > 0 ? m_imageHeight : m_size;
		int						slicePitch		= imageHeight*rowPitch;
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(slicePitch*(m_depth+m_skipImages) + m_offset);
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, m_depth, rowPitch, slicePitch, &data[0] + m_skipImages*slicePitch + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_IMAGE_HEIGHT,	m_imageHeight);
		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_IMAGES,	m_skipImages);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_internalFormat, m_size, m_size, m_depth, 0, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}